

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O3

string * __thiscall
upb::generator::MultipleSourceFilename_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,FileDefPtr file,string_view full_name,
          int *i)

{
  char *pcVar1;
  generator *this_00;
  long lVar2;
  char *pcVar3;
  int *piVar4;
  string_view fname;
  string local_100;
  AlphaNum local_e0;
  AlphaNum local_b0;
  AlphaNum local_80;
  undefined8 local_50;
  char *local_48;
  
  piVar4 = (int *)full_name._M_str;
  pcVar3 = (char *)full_name._M_len;
  *piVar4 = *piVar4 + 1;
  pcVar1 = upb_FileDef_Name((upb_FileDef *)this);
  this_00 = (generator *)strlen(pcVar1);
  fname._M_str = pcVar3;
  fname._M_len = (size_t)pcVar1;
  StripExtension_abi_cxx11_(&local_100,this_00,fname);
  local_b0.piece_._M_len = local_100._M_string_length;
  local_b0.piece_._M_str = local_100._M_dataplus._M_p;
  local_e0.piece_._M_len = 0x15;
  local_e0.piece_._M_str = ".upb_weak_minitables/";
  pcVar1 = local_80.digits_;
  lVar2 = absl::lts_20240722::numbers_internal::FastIntToBuffer(*piVar4,pcVar1);
  local_80.piece_._M_len = lVar2 - (long)pcVar1;
  local_50 = 6;
  local_48 = ".upb.c";
  local_80.piece_._M_str = pcVar1;
  absl::lts_20240722::StrCat_abi_cxx11_
            ((AlphaNum *)__return_storage_ptr__,&local_b0,&local_e0,&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MultipleSourceFilename(upb::FileDefPtr file,
                                   absl::string_view full_name, int* i) {
  *i += 1;
  return absl::StrCat(StripExtension(file.name()), ".upb_weak_minitables/",
                      *i, ".upb.c");
}